

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjedi_index_impl.h
# Opt level: O1

void __thiscall
json::QuickJEDITreeIndex<cost_model::UnitCostModelJSON<label::JSONLabel>,_node::TreeIndexJSON>::
step_five(QuickJEDITreeIndex<cost_model::UnitCostModelJSON<label::JSONLabel>,_node::TreeIndexJSON>
          *this,vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                *mask_matrix,unsigned_long *matrix_size,
         vector<double,_std::allocator<double>_> *row_cover,
         vector<double,_std::allocator<double>_> *col_cover,double *path_row_0,double *path_col_0,
         int *step)

{
  double dVar1;
  iterator iVar2;
  long lVar3;
  pointer pvVar4;
  double *pdVar5;
  unsigned_long uVar6;
  unsigned_long uVar7;
  int iVar8;
  unsigned_long r;
  unsigned_long uVar9;
  int iVar10;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  path;
  vector<double,_std::allocator<double>_> local_88;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_68;
  vector<double,_std::allocator<double>_> *local_48;
  vector<double,_std::allocator<double>_> *local_40;
  pointer local_38;
  
  local_68.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  std::
  vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>
  ::emplace_back<std::vector<double,std::allocator<double>>>
            ((vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>
              *)&local_68,&local_88);
  if (local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  iVar2._M_current =
       local_68.
       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish[-1].
       super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish
  ;
  if (iVar2._M_current ==
      local_68.
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish[-1].
      super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
              ((vector<double,std::allocator<double>> *)
               (local_68.
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish + -1),iVar2,path_row_0);
  }
  else {
    *iVar2._M_current = *path_row_0;
    local_68.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish[-1].
    super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
         iVar2._M_current + 1;
  }
  iVar2._M_current =
       local_68.
       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish[-1].
       super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish
  ;
  if (iVar2._M_current ==
      local_68.
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish[-1].
      super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
              ((vector<double,std::allocator<double>> *)
               (local_68.
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish + -1),iVar2,path_col_0);
  }
  else {
    *iVar2._M_current = *path_col_0;
    local_68.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish[-1].
    super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
         iVar2._M_current + 1;
  }
  local_48 = row_cover;
  local_40 = col_cover;
  while( true ) {
    if (*matrix_size == 0) {
      iVar10 = -1;
    }
    else {
      pvVar4 = (mask_matrix->
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      iVar10 = -1;
      uVar7 = 0;
      do {
        dVar1 = *(double *)
                 (*(long *)&(pvVar4->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                            super__Vector_impl_data +
                 (long)(int)local_68.
                            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish[-1].
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[1] * 8);
        iVar8 = (int)uVar7;
        if (dVar1 != 1.0) {
          iVar8 = iVar10;
        }
        if (!NAN(dVar1)) {
          iVar10 = iVar8;
        }
        uVar7 = uVar7 + 1;
        pvVar4 = pvVar4 + 1;
      } while (*matrix_size != uVar7);
    }
    if (iVar10 < 0) break;
    local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    std::
    vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>
    ::emplace_back<std::vector<double,std::allocator<double>>>
              ((vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>
                *)&local_68,&local_88);
    if (local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)(double)iVar10;
    iVar2._M_current =
         local_68.
         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish[-1].
         super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_finish;
    if (iVar2._M_current ==
        local_68.
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish[-1].
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                (local_68.
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + -1,iVar2,(double *)&local_88);
    }
    else {
      *iVar2._M_current =
           (double)local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
      local_68.
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish[-1].
      super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish
           = iVar2._M_current + 1;
    }
    iVar2._M_current =
         local_68.
         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish[-1].
         super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_finish;
    pdVar5 = local_68.
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish[-2].
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start + 1;
    if (iVar2._M_current ==
        local_68.
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish[-1].
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                ((vector<double,std::allocator<double>> *)
                 (local_68.
                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish + -1),iVar2,pdVar5);
    }
    else {
      *iVar2._M_current = *pdVar5;
      local_68.
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish[-1].
      super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish
           = iVar2._M_current + 1;
    }
    local_38 = (pointer)0xbff0000000000000;
    if (*matrix_size != 0) {
      iVar10 = -1;
      uVar7 = 0;
      do {
        dVar1 = *(double *)
                 (*(long *)&(mask_matrix->
                            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start
                            [(int)*local_68.
                                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish[-1].
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data._M_start].
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data + uVar7 * 8);
        iVar8 = (int)uVar7;
        if (dVar1 != 2.0) {
          iVar8 = iVar10;
        }
        if (NAN(dVar1)) {
          iVar8 = iVar10;
        }
        iVar10 = iVar8;
        uVar7 = uVar7 + 1;
      } while (*matrix_size != uVar7);
      local_38 = (pointer)(double)iVar10;
    }
    local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    std::
    vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>
    ::emplace_back<std::vector<double,std::allocator<double>>>
              ((vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>
                *)&local_68,&local_88);
    if (local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    pdVar5 = local_68.
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish[-2].
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    iVar2._M_current =
         local_68.
         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish[-1].
         super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_finish;
    if (iVar2._M_current ==
        local_68.
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish[-1].
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                ((vector<double,std::allocator<double>> *)
                 (local_68.
                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish + -1),iVar2,pdVar5);
    }
    else {
      *iVar2._M_current = *pdVar5;
      local_68.
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish[-1].
      super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish
           = iVar2._M_current + 1;
    }
    local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = local_38;
    iVar2._M_current =
         local_68.
         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish[-1].
         super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_finish;
    if (iVar2._M_current ==
        local_68.
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish[-1].
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                (local_68.
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + -1,iVar2,(double *)&local_88);
    }
    else {
      *iVar2._M_current = (double)local_38;
      local_68.
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish[-1].
      super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish
           = iVar2._M_current + 1;
    }
  }
  augment_path(this,mask_matrix,&local_68);
  uVar7 = *matrix_size;
  if (uVar7 != 0) {
    uVar9 = 0;
    memset((local_48->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start,0,uVar7 * 8);
    memset((local_40->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start,0,uVar7 * 8);
    pvVar4 = (mask_matrix->
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    do {
      lVar3 = *(long *)&pvVar4[uVar9].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data;
      uVar6 = 0;
      do {
        dVar1 = *(double *)(lVar3 + uVar6 * 8);
        if ((dVar1 == 2.0) && (!NAN(dVar1))) {
          *(undefined8 *)(lVar3 + uVar6 * 8) = 0;
        }
        uVar6 = uVar6 + 1;
      } while (uVar7 != uVar6);
      uVar9 = uVar9 + 1;
    } while (uVar9 != uVar7);
  }
  *step = 3;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_68);
  return;
}

Assistant:

void QuickJEDITreeIndex<cost_matrixModel, TreeIndex>::step_five(
    std::vector<std::vector<double> >& mask_matrix,
    unsigned long& matrix_size,
    std::vector<double>& row_cover,
    std::vector<double>& col_cover,
    double& path_row_0, double& path_col_0,
    int& step)
{
  int r = -1;
  int c = -1;

  std::vector<std::vector<double> > path;
  path.push_back(std::vector<double>());
  path[path.size() - 1].push_back(path_row_0);
  path[path.size() - 1].push_back(path_col_0);

  while (1)
  {
    find_star_in_col(mask_matrix, matrix_size, r, path[path.size() - 1][1]);
    if (r > -1)
    {
      path.push_back(std::vector<double>());
      path[path.size() - 1].push_back(r);
      path[path.size() - 1].push_back(path[path.size() - 2][1]);
    }
    else
    {
      break;
    }
    find_prime_in_row(mask_matrix, matrix_size, path[path.size() - 1][0], c);
    path.push_back(std::vector<double>());
    path[path.size() - 1].push_back(path[path.size() - 2][0]);
    path[path.size() - 1].push_back(c);
  }
  augment_path(mask_matrix, path);
  clear_covers(matrix_size, row_cover, col_cover);
  erase_primes(mask_matrix, matrix_size);
  step = 3;
}